

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O3

bool __thiscall
phmap::priv::
raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs::statement_block_*>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs::statement_block_*>_>_>
::find_impl<cs_impl::any>
          (raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs::statement_block_*>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs::statement_block_*>_>_>
           *this,key_arg<cs_impl::any> *key,size_t hashval,size_t *offset)

{
  char *pcVar1;
  ulong uVar2;
  proxy *ppVar3;
  proxy *ppVar4;
  uint uVar5;
  bool bVar6;
  ushort uVar7;
  char cVar8;
  char cVar9;
  char cVar10;
  char cVar11;
  char cVar12;
  char cVar13;
  char cVar14;
  char cVar15;
  char cVar16;
  char cVar17;
  char cVar18;
  char cVar19;
  char cVar20;
  char cVar21;
  char cVar22;
  char cVar23;
  int iVar24;
  uint uVar25;
  ulong uVar26;
  ulong uVar27;
  long lVar28;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  __m128i match;
  char cVar29;
  char cVar34;
  char cVar35;
  char cVar36;
  
  uVar2 = this->capacity_;
  if ((uVar2 + 1 & uVar2) != 0) {
    __assert_fail("((mask + 1) & mask) == 0 && \"not a mask\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/csbuild/deps/include/covscript/import/parallel_hashmap/phmap.h"
                  ,0x96,"phmap::priv::probe_seq<16>::probe_seq(size_t, size_t) [Width = 16]");
  }
  uVar27 = hashval >> 7;
  auVar30 = ZEXT216(CONCAT11((char)hashval,(char)hashval) & 0x7f7f);
  auVar31 = pshuflw(auVar30,auVar30,0);
  lVar28 = 0;
  auVar30 = _DAT_001ea010;
  while( true ) {
    uVar27 = uVar27 & uVar2;
    pcVar1 = this->ctrl_ + uVar27;
    cVar8 = *pcVar1;
    cVar9 = pcVar1[1];
    cVar10 = pcVar1[2];
    cVar11 = pcVar1[3];
    cVar12 = pcVar1[4];
    cVar13 = pcVar1[5];
    cVar14 = pcVar1[6];
    cVar15 = pcVar1[7];
    cVar16 = pcVar1[8];
    cVar17 = pcVar1[9];
    cVar18 = pcVar1[10];
    cVar19 = pcVar1[0xb];
    cVar20 = pcVar1[0xc];
    cVar21 = pcVar1[0xd];
    cVar22 = pcVar1[0xe];
    cVar23 = pcVar1[0xf];
    cVar29 = auVar31[0];
    auVar32[0] = -(cVar29 == cVar8);
    cVar34 = auVar31[1];
    auVar32[1] = -(cVar34 == cVar9);
    cVar35 = auVar31[2];
    auVar32[2] = -(cVar35 == cVar10);
    cVar36 = auVar31[3];
    auVar32[3] = -(cVar36 == cVar11);
    auVar32[4] = -(cVar29 == cVar12);
    auVar32[5] = -(cVar34 == cVar13);
    auVar32[6] = -(cVar35 == cVar14);
    auVar32[7] = -(cVar36 == cVar15);
    auVar32[8] = -(cVar29 == cVar16);
    auVar32[9] = -(cVar34 == cVar17);
    auVar32[10] = -(cVar35 == cVar18);
    auVar32[0xb] = -(cVar36 == cVar19);
    auVar32[0xc] = -(cVar29 == cVar20);
    auVar32[0xd] = -(cVar34 == cVar21);
    auVar32[0xe] = -(cVar35 == cVar22);
    auVar32[0xf] = -(cVar36 == cVar23);
    uVar7 = (ushort)(SUB161(auVar32 >> 7,0) & 1) | (ushort)(SUB161(auVar32 >> 0xf,0) & 1) << 1 |
            (ushort)(SUB161(auVar32 >> 0x17,0) & 1) << 2 |
            (ushort)(SUB161(auVar32 >> 0x1f,0) & 1) << 3 |
            (ushort)(SUB161(auVar32 >> 0x27,0) & 1) << 4 |
            (ushort)(SUB161(auVar32 >> 0x2f,0) & 1) << 5 |
            (ushort)(SUB161(auVar32 >> 0x37,0) & 1) << 6 |
            (ushort)(SUB161(auVar32 >> 0x3f,0) & 1) << 7 |
            (ushort)(SUB161(auVar32 >> 0x47,0) & 1) << 8 |
            (ushort)(SUB161(auVar32 >> 0x4f,0) & 1) << 9 |
            (ushort)(SUB161(auVar32 >> 0x57,0) & 1) << 10 |
            (ushort)(SUB161(auVar32 >> 0x5f,0) & 1) << 0xb |
            (ushort)(SUB161(auVar32 >> 0x67,0) & 1) << 0xc |
            (ushort)(SUB161(auVar32 >> 0x6f,0) & 1) << 0xd |
            (ushort)(SUB161(auVar32 >> 0x77,0) & 1) << 0xe | (ushort)(auVar32[0xf] >> 7) << 0xf;
    if (uVar7 != 0) {
      uVar25 = (uint)uVar7;
      do {
        uVar5 = 0;
        if (uVar25 != 0) {
          for (; (uVar25 >> uVar5 & 1) == 0; uVar5 = uVar5 + 1) {
          }
        }
        uVar26 = uVar5 + uVar27 & uVar2;
        *offset = uVar26;
        ppVar3 = this->slots_[uVar26].value.first.mDat;
        ppVar4 = key->mDat;
        if (ppVar4 == (proxy *)0x0 || ppVar3 == (proxy *)0x0) {
          if (ppVar3 == (proxy *)0x0 && ppVar4 == (proxy *)0x0) {
            return true;
          }
        }
        else {
          iVar24 = (*ppVar3->data->_vptr_baseHolder[4])(ppVar3->data,ppVar4->data);
          auVar30 = _DAT_001ea010;
          if ((char)iVar24 != '\0') {
            return true;
          }
        }
        uVar25 = uVar25 - 1 & uVar25;
      } while (uVar25 != 0);
    }
    auVar33[0] = -(cVar8 == auVar30[0]);
    auVar33[1] = -(cVar9 == auVar30[1]);
    auVar33[2] = -(cVar10 == auVar30[2]);
    auVar33[3] = -(cVar11 == auVar30[3]);
    auVar33[4] = -(cVar12 == auVar30[4]);
    auVar33[5] = -(cVar13 == auVar30[5]);
    auVar33[6] = -(cVar14 == auVar30[6]);
    auVar33[7] = -(cVar15 == auVar30[7]);
    auVar33[8] = -(cVar16 == auVar30[8]);
    auVar33[9] = -(cVar17 == auVar30[9]);
    auVar33[10] = -(cVar18 == auVar30[10]);
    auVar33[0xb] = -(cVar19 == auVar30[0xb]);
    auVar33[0xc] = -(cVar20 == auVar30[0xc]);
    auVar33[0xd] = -(cVar21 == auVar30[0xd]);
    auVar33[0xe] = -(cVar22 == auVar30[0xe]);
    bVar6 = cVar23 == auVar30[0xf];
    auVar33[0xf] = -bVar6;
    if ((((((((((((((((auVar33 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (auVar33 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar33 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar33 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar33 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar33 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar33 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
               (auVar33 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar33 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
             (auVar33 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar33 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
           (auVar33 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar33 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
         (auVar33 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (auVar33 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) || bVar6) break;
    uVar27 = uVar27 + lVar28 + 0x10;
    lVar28 = lVar28 + 0x10;
  }
  return false;
}

Assistant:

probe_seq<Group::kWidth> probe(size_t hashval) const
			{
				return probe_seq<Group::kWidth>(H1(hashval, ctrl_), capacity_);
			}